

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_setfield(lua_State *L,int idx,char *k)

{
  GCstr *pGVar1;
  TValue *pTVar2;
  lua_State *in_RDX;
  int in_ESI;
  TValue *in_RDI;
  TValue *base;
  cTValue *t;
  TValue key;
  TValue *o;
  TValue *o_1;
  TValue *pTVar3;
  undefined4 uVar4;
  cTValue *in_stack_fffffffffffffef8;
  cTValue *in_stack_ffffffffffffff00;
  lua_State *L_00;
  size_t in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  lua_State *in_stack_ffffffffffffff40;
  
  index2adr((lua_State *)&in_RDI->field_2,in_ESI);
  pTVar3 = in_RDI;
  L_00 = in_RDX;
  strlen((char *)in_RDX);
  pGVar1 = lj_str_new(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30)
  ;
  uVar4 = (int)pGVar1;
  uVar4 = 0xfffffffb;
  pTVar2 = lj_meta_tset(L_00,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if (pTVar2 == (TValue *)0x0) {
    pTVar2 = (TValue *)in_RDI[3].u64;
    pTVar2[2] = pTVar2[-3];
    in_RDI[3].u64 = (uint64_t)(pTVar2 + 3);
    jit_secure_call((lua_State *)&pTVar2->field_2,pTVar3,(int)((ulong)in_RDX >> 0x20));
    in_RDI[3].u64 = (uint64_t)((TValue *)in_RDI[3].u64 + -2);
  }
  else {
    pTVar3 = (TValue *)in_RDI[3].u64;
    in_RDI[3].u64 = (uint64_t)(pTVar3 + -1);
    *pTVar2 = pTVar3[-1];
  }
  return;
}

Assistant:

LUA_API void lua_setfield(lua_State *L, int idx, const char *k)
{
  TValue *o;
  TValue key;
  cTValue *t = index2adr_check(L, idx);
  lj_checkapi_slot(1);
  setstrV(L, &key, lj_str_newz(L, k));
  o = lj_meta_tset(L, t, &key);
  if (o) {
    /* NOBARRIER: lj_meta_tset ensures the table is not black. */
    copyTV(L, o, --L->top);
  } else {
    TValue *base = L->top;
    copyTV(L, base+2, base-3-2*LJ_FR2);
    L->top = base+3;
    jit_secure_call(L, base, 0+1);
    L->top -= 2+LJ_FR2;
  }
}